

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult(secp256k1_gej *r,secp256k1_gej *a,secp256k1_scalar *na,secp256k1_scalar *ng)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  bool bVar65;
  undefined1 auVar66 [16];
  undefined4 in_EAX;
  int iVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  long lVar71;
  long lVar72;
  ulong uVar73;
  secp256k1_scalar *psVar74;
  secp256k1_fe *z;
  long lVar75;
  long lVar76;
  secp256k1_ge *psVar77;
  secp256k1_gej *psVar78;
  size_t len;
  secp256k1_ge *psVar79;
  ulong uVar80;
  long lVar81;
  ulong uVar82;
  ulong uVar83;
  byte bVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  secp256k1_scalar na_lam;
  secp256k1_fe Z;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  secp256k1_strauss_point_state ps [1];
  undefined1 local_d48 [64];
  long lStack_d08;
  uint64_t local_d00;
  int local_cf8;
  undefined1 local_cd8 [16];
  ulong uStack_cc8;
  undefined1 local_cc0 [16];
  undefined1 local_ca8 [16];
  undefined1 local_c98 [16];
  uint64_t local_c88;
  uint64_t uStack_c80;
  undefined1 local_c78 [16];
  secp256k1_fe local_c68 [8];
  secp256k1_ge local_b28 [7];
  uint uStack_86c;
  secp256k1_scalar local_868 [16];
  uint uStack_65c;
  secp256k1_gej local_658 [4];
  uint auStack_44c [129];
  uint auStack_248 [130];
  uint local_40;
  uint local_3c;
  
  bVar84 = 0;
  local_cd8._0_8_ = 1;
  stack0xfffffffffffff330 = (undefined1  [16])0x0;
  local_cc0 = (undefined1  [16])0x0;
  auVar85 = *(undefined1 (*) [16])(na->d + 2) | *(undefined1 (*) [16])na->d;
  auVar86._0_4_ = -(uint)(auVar85._0_4_ == 0);
  auVar86._4_4_ = -(uint)(auVar85._4_4_ == 0);
  auVar86._8_4_ = -(uint)(auVar85._8_4_ == 0);
  auVar86._12_4_ = -(uint)(auVar85._12_4_ == 0);
  iVar67 = movmskps(in_EAX,auVar86);
  bVar5 = true;
  if ((iVar67 == 0xf) || (a->infinity != 0)) {
    uVar70 = 0;
    bVar65 = false;
    len = 0;
    z = (secp256k1_fe *)ng;
  }
  else {
    psVar74 = ng;
    secp256k1_scalar_split_lambda(local_868,(secp256k1_scalar *)local_d48,na);
    iVar67 = (int)psVar74;
    local_40 = secp256k1_ecmult_wnaf
                         ((int *)(auStack_44c + 1),(int)local_868,(secp256k1_scalar *)0x5,iVar67);
    local_3c = secp256k1_ecmult_wnaf
                         ((int *)(auStack_248 + 1),(int)(secp256k1_scalar *)local_d48,
                          (secp256k1_scalar *)0x5,iVar67);
    uVar70 = local_3c;
    if ((int)local_3c < (int)local_40) {
      uVar70 = local_40;
    }
    bVar5 = false;
    if ((int)uVar70 < 1) {
      uVar70 = 0;
    }
    psVar78 = local_658;
    for (lVar76 = 0x10; lVar76 != 0; lVar76 = lVar76 + -1) {
      (psVar78->x).n[0] = (a->x).n[0];
      a = (secp256k1_gej *)((long)a + (ulong)bVar84 * -0x10 + 8);
      psVar78 = (secp256k1_gej *)((long)psVar78 + (ulong)bVar84 * -0x10 + 8);
    }
    z = (secp256k1_fe *)local_cd8;
    secp256k1_ecmult_odd_multiples_table(8,local_b28,local_c68,z,local_658);
    len = 8;
    bVar65 = true;
  }
  if (!bVar5) {
    secp256k1_ge_table_set_globalz(len,local_b28,local_c68);
  }
  iVar67 = (int)z;
  if (bVar65) {
    psVar77 = local_b28;
    lVar76 = 0;
    do {
      secp256k1_fe_impl_mul
                ((secp256k1_fe *)((long)local_c68[0].n + lVar76),&psVar77->x,&secp256k1_const_beta);
      iVar67 = (int)z;
      lVar76 = lVar76 + 0x28;
      psVar77 = psVar77 + 1;
    } while (lVar76 != 0x140);
  }
  if (ng == (secp256k1_scalar *)0x0) {
    lVar81 = 0;
    lVar76 = 0;
  }
  else {
    local_c88 = ng->d[0];
    uStack_c80 = ng->d[1];
    local_c78 = (undefined1  [16])0x0;
    local_ca8 = *(undefined1 (*) [16])(ng->d + 2);
    local_c98 = (undefined1  [16])0x0;
    uVar68 = secp256k1_ecmult_wnaf((int *)local_658,(int)&local_c88,(secp256k1_scalar *)0xf,iVar67);
    uVar69 = secp256k1_ecmult_wnaf((int *)local_868,(int)local_ca8,(secp256k1_scalar *)0xf,iVar67);
    if ((int)uVar70 < (int)uVar68) {
      uVar70 = uVar68;
    }
    if ((int)uVar70 < (int)uVar69) {
      uVar70 = uVar69;
    }
    lVar76 = (long)(int)uVar69;
    lVar81 = (long)(int)uVar68;
  }
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if (0 < (int)uVar70) {
    lVar71 = (long)(int)local_40;
    lVar72 = (long)(int)local_3c;
    uVar80 = (ulong)uVar70;
    do {
      if (r->infinity == 0) {
        secp256k1_gej_double(r,r);
      }
      else {
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
      }
      if (bVar65) {
        if (((long)uVar80 <= lVar71) && (uVar70 = auStack_44c[uVar80], uVar70 != 0)) {
          if ((int)uVar70 < 1) {
            psVar77 = local_b28 + (~uVar70 >> 1);
            psVar79 = (secp256k1_ge *)local_d48;
            for (lVar75 = 0xb; lVar75 != 0; lVar75 = lVar75 + -1) {
              (psVar79->x).n[0] = (psVar77->x).n[0];
              psVar77 = (secp256k1_ge *)((long)psVar77 + ((ulong)bVar84 * -2 + 1) * 8);
              psVar79 = (secp256k1_ge *)((long)psVar79 + (ulong)bVar84 * -0x10 + 8);
            }
            local_d48._40_8_ = 0x3ffffbfffff0bc - local_d48._40_8_;
            local_d48._48_8_ = 0x3ffffffffffffc - local_d48._48_8_;
            lVar75 = local_d48._56_8_;
            lStack_d08 = 0x3ffffffffffffc - local_d48._64_8_;
            local_d48._56_8_ = 0x3ffffffffffffc - lVar75;
            local_d00 = 0x3fffffffffffc - local_d00;
          }
          else {
            psVar77 = local_b28 + (uVar70 - 1 >> 1);
            psVar79 = (secp256k1_ge *)local_d48;
            for (lVar75 = 0xb; lVar75 != 0; lVar75 = lVar75 + -1) {
              (psVar79->x).n[0] = (psVar77->x).n[0];
              psVar77 = (secp256k1_ge *)((long)psVar77 + ((ulong)bVar84 * -2 + 1) * 8);
              psVar79 = (secp256k1_ge *)((long)psVar79 + (ulong)bVar84 * -0x10 + 8);
            }
          }
          secp256k1_gej_add_ge_var(r,r,(secp256k1_ge *)local_d48,(secp256k1_fe *)0x0);
        }
        if (((long)uVar80 <= lVar72) && (uVar70 = auStack_248[uVar80], uVar70 != 0)) {
          local_cf8 = 0;
          if ((int)uVar70 < 1) {
            uVar70 = ~uVar70 >> 1;
            local_d48._32_8_ = local_c68[uVar70].n[4];
            local_d48._0_8_ = local_c68[uVar70].n[0];
            local_d48._8_8_ = local_c68[uVar70].n[1];
            local_d48._16_8_ = local_c68[uVar70].n[2];
            local_d48._24_8_ = local_c68[uVar70].n[3];
            local_d48._40_8_ = 0x3ffffbfffff0bc - local_b28[uVar70].y.n[0];
            local_d48._48_8_ = 0x3ffffffffffffc - local_b28[uVar70].y.n[1];
            lStack_d08 = 0x3ffffffffffffc - local_b28[uVar70].y.n[3];
            local_d48._56_8_ = 0x3ffffffffffffc - local_b28[uVar70].y.n[2];
            local_d00 = 0x3fffffffffffc - local_b28[uVar70].y.n[4];
          }
          else {
            uVar70 = uVar70 - 1 >> 1;
            local_d48._32_8_ = local_c68[uVar70].n[4];
            local_d48._0_8_ = local_c68[uVar70].n[0];
            local_d48._8_8_ = local_c68[uVar70].n[1];
            local_d48._16_8_ = local_c68[uVar70].n[2];
            local_d48._24_8_ = local_c68[uVar70].n[3];
            local_d00 = local_b28[uVar70].y.n[4];
            local_d48._40_8_ = local_b28[uVar70].y.n[0];
            local_d48._48_8_ = local_b28[uVar70].y.n[1];
            unique0x00006c80 = *(undefined1 (*) [16])(local_b28[uVar70].y.n + 2);
          }
          secp256k1_gej_add_ge_var(r,r,(secp256k1_ge *)local_d48,(secp256k1_fe *)0x0);
        }
      }
      if (((long)uVar80 <= lVar81) && (uVar70 = (&uStack_65c)[uVar80], uVar70 != 0)) {
        if ((int)uVar70 < 1) {
          secp256k1_ge_from_storage((secp256k1_ge *)local_d48,secp256k1_pre_g + (~uVar70 >> 1));
          local_d48._40_8_ = 0x3ffffbfffff0bc - local_d48._40_8_;
          local_d48._48_8_ = 0x3ffffffffffffc - local_d48._48_8_;
          lVar75 = local_d48._56_8_;
          lStack_d08 = 0x3ffffffffffffc - local_d48._64_8_;
          local_d48._56_8_ = 0x3ffffffffffffc - lVar75;
          local_d00 = 0x3fffffffffffc - local_d00;
        }
        else {
          secp256k1_ge_from_storage((secp256k1_ge *)local_d48,secp256k1_pre_g + (uVar70 - 1 >> 1));
        }
        secp256k1_gej_add_zinv_var(r,r,(secp256k1_ge *)local_d48,(secp256k1_fe *)local_cd8);
      }
      if (((long)uVar80 <= lVar76) && (uVar70 = (&uStack_86c)[uVar80], uVar70 != 0)) {
        if ((int)uVar70 < 1) {
          secp256k1_ge_from_storage((secp256k1_ge *)local_d48,secp256k1_pre_g_128 + (~uVar70 >> 1));
          local_d48._40_8_ = 0x3ffffbfffff0bc - local_d48._40_8_;
          local_d48._48_8_ = 0x3ffffffffffffc - local_d48._48_8_;
          lVar75 = local_d48._56_8_;
          lStack_d08 = 0x3ffffffffffffc - local_d48._64_8_;
          local_d48._56_8_ = 0x3ffffffffffffc - lVar75;
          local_d00 = 0x3fffffffffffc - local_d00;
        }
        else {
          secp256k1_ge_from_storage
                    ((secp256k1_ge *)local_d48,secp256k1_pre_g_128 + (uVar70 - 1 >> 1));
        }
        secp256k1_gej_add_zinv_var(r,r,(secp256k1_ge *)local_d48,(secp256k1_fe *)local_cd8);
      }
      bVar5 = 1 < (long)uVar80;
      uVar80 = uVar80 - 1;
    } while (bVar5);
  }
  if (r->infinity == 0) {
    uVar80 = (r->z).n[0];
    uVar1 = (r->z).n[1];
    uVar2 = (r->z).n[2];
    uVar3 = (r->z).n[3];
    auVar85._8_8_ = 0;
    auVar85._0_8_ = local_cc0._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar80;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uStack_cc8;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar1;
    uVar4 = (r->z).n[4];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_cd8._8_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_cd8._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar3;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_cc0._8_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar4;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = SUB168(auVar9 * auVar40,0);
    auVar6 = auVar6 * auVar37 + auVar85 * auVar36 + auVar7 * auVar38 + auVar8 * auVar39 +
             auVar10 * ZEXT816(0x1000003d10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_cc0._8_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar80;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_cc0._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar1;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uStack_cc8;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar2;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_cd8._8_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar3;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_cd8._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar4;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = SUB168(auVar9 * auVar40,8);
    auVar85 = auVar16 * ZEXT816(0x1000003d10000) +
              auVar15 * auVar45 + auVar14 * auVar44 + auVar13 * auVar43 + auVar12 * auVar42 +
              auVar11 * auVar41 + (auVar6 >> 0x34);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_cd8._0_8_;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar80;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_cc0._8_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar1;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_cc0._0_8_;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar2;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uStack_cc8;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar3;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_cd8._8_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar4;
    auVar86 = (auVar85 >> 0x34) +
              auVar21 * auVar50 + auVar20 * auVar49 + auVar19 * auVar48 + auVar18 * auVar47;
    uVar73 = auVar86._0_8_;
    uVar82 = auVar86._8_8_;
    auVar66._8_8_ = uVar82 >> 0x34;
    auVar66._0_8_ = uVar82 * 0x1000 | uVar73 >> 0x34;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar73 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar85._6_2_ & 0xf);
    auVar86 = auVar22 * ZEXT816(0x1000003d1) + auVar17 * auVar46;
    uVar73 = auVar86._0_8_;
    uVar82 = auVar86._8_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_cd8._8_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar80;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_cd8._0_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar1;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_cc0._8_8_;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar2;
    auVar61._8_8_ = uVar82 >> 0x34;
    auVar61._0_8_ = uVar82 * 0x1000 | uVar73 >> 0x34;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_cc0._0_8_;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar3;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uStack_cc8;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar4;
    auVar66 = auVar25 * auVar53 + auVar27 * auVar55 + auVar26 * auVar54 + auVar66;
    uVar82 = auVar66._0_8_;
    uVar83 = auVar66._8_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar82 & 0xfffffffffffff;
    auVar61 = auVar28 * ZEXT816(0x1000003d10) + auVar23 * auVar51 + auVar24 * auVar52 + auVar61;
    auVar62._8_8_ = uVar83 >> 0x34;
    auVar62._0_8_ = uVar83 * 0x1000 | uVar82 >> 0x34;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uStack_cc8;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar80;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_cd8._8_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar1;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_cd8._0_8_;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar2;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_cc0._8_8_;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar3;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_cc0._0_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar4;
    auVar62 = auVar33 * auVar60 + auVar32 * auVar59 + auVar62;
    (r->z).n[0] = uVar73 & 0xfffffffffffff;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auVar62._0_8_;
    (r->z).n[1] = auVar61._0_8_ & 0xfffffffffffff;
    auVar86 = auVar34 * ZEXT816(0x1000003d10) +
              auVar31 * auVar58 + auVar29 * auVar56 + auVar30 * auVar57 + (auVar61 >> 0x34);
    auVar7 = auVar86 >> 0x34;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = auVar7._0_8_;
    (r->z).n[2] = auVar86._0_8_ & 0xfffffffffffff;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = auVar62._8_8_;
    auVar63._8_8_ = auVar7._8_8_;
    auVar63._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar64 = auVar35 * ZEXT816(0x1000003d10000) + auVar63 + auVar64;
    uVar80 = auVar64._0_8_;
    (r->z).n[3] = uVar80 & 0xfffffffffffff;
    (r->z).n[4] = (auVar64._8_8_ << 0xc | uVar80 >> 0x34) + (auVar85._0_8_ & 0xffffffffffff);
  }
  return;
}

Assistant:

static void secp256k1_ecmult(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_fe aux[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
    struct secp256k1_strauss_state state;

    state.aux = aux;
    state.pre_a = pre_a;
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&state, r, 1, a, na, ng);
}